

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

void FilterLoop26_C(uint8_t *p,int hstride,int vstride,int size,int thresh,int ithresh,
                   int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  
  if (0 < size) {
    lVar10 = (long)hstride;
    lVar15 = -lVar10;
    uVar7 = size + 1;
    do {
      uVar13 = (ulong)p[lVar10 * -2];
      bVar1 = p[lVar15];
      uVar5 = (ulong)bVar1;
      bVar2 = *p;
      uVar9 = (ulong)bVar2;
      uVar16 = (ulong)p[lVar10];
      if (((((int)((uint)abs0[(uVar13 - uVar16) + 0xff] + (uint)abs0[(uVar5 - uVar9) + 0xff] * 4) <=
             thresh * 2 + 1) &&
           (uVar14 = (ulong)p[lVar10 * -3],
           (int)(uint)abs0[(p[hstride * -4] - uVar14) + 0xff] <= ithresh)) &&
          ((uint)abs0[(uVar14 - uVar13) + 0xff] <= (uint)ithresh)) &&
         ((uint)abs0[(uVar13 - uVar5) + 0xff] <= (uint)ithresh)) {
        bVar3 = p[hstride * 2];
        if ((((uint)abs0[((ulong)p[lVar10 * 3] - (ulong)bVar3) + 0xff] <= (uint)ithresh) &&
            ((uint)abs0[(bVar3 - uVar16) + 0xff] <= (uint)ithresh)) &&
           ((uint)abs0[(uVar16 - uVar9) + 0xff] <= (uint)ithresh)) {
          if ((hev_thresh < (int)(uint)abs0[(uVar13 - (uint)bVar1) + 0xff]) ||
             ((uint)hev_thresh < (uint)abs0[(uVar16 - uVar9) + 0xff])) {
            iVar8 = ((uint)bVar2 - (uint)bVar1) * 3;
            uVar4 = sclip2[(long)((char)sclip1[(uVar13 - uVar16) + 0x3fc] + iVar8 + 4 >> 3) + 0x70];
            p[lVar15] = ""[(long)(char)sclip2[(long)(iVar8 + (char)sclip1[(uVar13 - uVar16) + 0x3fc]
                                                     + 3 >> 3) + 0x70] + uVar5 + 0xff];
            iVar8 = (uint)bVar2 - (int)(char)uVar4;
            pbVar6 = p;
          }
          else {
            iVar8 = (int)(char)sclip1[(long)(char)sclip1[(uVar13 - uVar16) + 0x3fc] +
                                      (uVar9 - uVar5) * 3 + 0x3fc];
            lVar12 = (long)(iVar8 * 0x1b + 0x3f >> 7);
            lVar11 = (long)(iVar8 * 0x12 + 0x3f >> 7);
            iVar8 = iVar8 * 9 + 0x3f >> 7;
            p[lVar10 * -3] = ""[uVar14 + (long)iVar8 + 0xff];
            p[lVar10 * -2] = ""[lVar11 + uVar13 + 0xff];
            p[lVar15] = ""[uVar5 + lVar12 + 0xff];
            *p = ""[(uVar9 - lVar12) + 0xff];
            p[lVar10] = ""[(uVar16 - lVar11) + 0xff];
            iVar8 = (uint)bVar3 - iVar8;
            pbVar6 = p + hstride * 2;
          }
          *pbVar6 = ""[(long)iVar8 + 0xff];
        }
      }
      p = p + vstride;
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
  }
  return;
}

Assistant:

static WEBP_INLINE void FilterLoop26_C(uint8_t* p,
                                       int hstride, int vstride, int size,
                                       int thresh, int ithresh,
                                       int hev_thresh) {
  const int thresh2 = 2 * thresh + 1;
  while (size-- > 0) {
    if (NeedsFilter2_C(p, hstride, thresh2, ithresh)) {
      if (Hev(p, hstride, hev_thresh)) {
        DoFilter2_C(p, hstride);
      } else {
        DoFilter6_C(p, hstride);
      }
    }
    p += vstride;
  }
}